

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

bool cmOutputConverterIsShellOperator(string *str)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  allocator local_2a9;
  value_type local_2a8;
  _Base_ptr local_288;
  undefined1 local_280;
  allocator local_271;
  value_type local_270;
  _Base_ptr local_250;
  undefined1 local_248;
  allocator local_239;
  value_type local_238;
  _Base_ptr local_218;
  undefined1 local_210;
  allocator local_201;
  value_type local_200;
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  allocator local_1c9;
  value_type local_1c8;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  allocator local_191;
  value_type local_190;
  _Base_ptr local_170;
  undefined1 local_168;
  allocator local_159;
  value_type local_158;
  _Base_ptr local_138;
  undefined1 local_130;
  allocator local_121;
  value_type local_120;
  _Base_ptr local_100;
  undefined1 local_f8;
  allocator local_e9;
  value_type local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  allocator local_b1;
  value_type local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  allocator local_79;
  value_type local_78;
  _Base_ptr local_58;
  undefined1 local_50;
  allocator local_31;
  value_type local_30;
  string *local_10;
  string *str_local;
  
  local_10 = str;
  if ((cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_ ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                                   shellOperators_abi_cxx11_), iVar2 != 0)) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_)
    ;
    __cxa_atexit(std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~set,&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                         shellOperators_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                         shellOperators_abi_cxx11_);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                   shellOperators_abi_cxx11_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"<",&local_31);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_30);
    local_58 = (_Base_ptr)pVar4.first._M_node;
    local_50 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,">",&local_79);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_78);
    local_90 = (_Base_ptr)pVar4.first._M_node;
    local_88 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"<<",&local_b1);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_b0);
    local_c8 = (_Base_ptr)pVar4.first._M_node;
    local_c0 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,">>",&local_e9);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_e8);
    local_100 = (_Base_ptr)pVar4.first._M_node;
    local_f8 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"|",&local_121);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_120);
    local_138 = (_Base_ptr)pVar4.first._M_node;
    local_130 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"||",&local_159);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_158);
    local_170 = (_Base_ptr)pVar4.first._M_node;
    local_168 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"&&",&local_191);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_190);
    local_1a8 = (_Base_ptr)pVar4.first._M_node;
    local_1a0 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"&>",&local_1c9);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_1c8);
    local_1e0 = (_Base_ptr)pVar4.first._M_node;
    local_1d8 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"1>",&local_201);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_200);
    local_218 = (_Base_ptr)pVar4.first._M_node;
    local_210 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,"2>",&local_239);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_238);
    local_250 = (_Base_ptr)pVar4.first._M_node;
    local_248 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"2>&1",&local_271);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                      shellOperators_abi_cxx11_,&local_270);
    local_288 = (_Base_ptr)pVar4.first._M_node;
    local_280 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"1>&2",&local_2a9);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
              shellOperators_abi_cxx11_,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  }
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                   shellOperators_abi_cxx11_,local_10);
  return sVar3 != 0;
}

Assistant:

static bool cmOutputConverterIsShellOperator(const std::string& str)
{
  static std::set<std::string> shellOperators;
  if(shellOperators.empty())
    {
    shellOperators.insert("<");
    shellOperators.insert(">");
    shellOperators.insert("<<");
    shellOperators.insert(">>");
    shellOperators.insert("|");
    shellOperators.insert("||");
    shellOperators.insert("&&");
    shellOperators.insert("&>");
    shellOperators.insert("1>");
    shellOperators.insert("2>");
    shellOperators.insert("2>&1");
    shellOperators.insert("1>&2");
    }
  return shellOperators.count(str) > 0;
}